

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

xml_node __thiscall
NULLCPugiXML::xml_node__next_sibling0(NULLCPugiXML *this,NULLCArray name,xml_node *ptr)

{
  xml_node *ptr_local;
  NULLCArray name_local;
  xml_node ret;
  
  name_local.ptr._0_4_ = name.ptr._0_4_;
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("name is empty");
    memset((void *)((long)&name_local.ptr + 4),0,8);
    xml_node::xml_node((xml_node *)((long)&name_local.ptr + 4));
  }
  else {
    xml_node::xml_node((xml_node *)((long)&name_local.ptr + 4));
    name_local._4_8_ =
         pugi::xml_node::next_sibling
                   ((xml_node *)CONCAT44((int)((ulong)register0x00000010 >> 0x20),name.len),
                    (char_t *)this);
  }
  return (xml_node)(xml_node)name_local._4_8_;
}

Assistant:

xml_node xml_node__next_sibling0(NULLCArray name, xml_node* ptr)
	{
		if(!name.ptr)
		{
			nullcThrowError("name is empty");
			return xml_node();
		}
		xml_node ret;
		ret.node = ptr->node.next_sibling(name.ptr);
		return ret;
	}